

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWCommon.cxx
# Opt level: O3

void __thiscall cmCPackIFWCommon::WriteGeneratedByToStrim(cmCPackIFWCommon *this,cmXMLWriter *xout)

{
  bool bVar1;
  ostringstream comment;
  cmTimestamp local_1d1;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [376];
  
  if (this->Generator != (cmCPackIFWGenerator *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Generated by CPack ",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"3.29.20240330-ge5f7ff8",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," IFW generator ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"for QtIFW ",10);
    bVar1 = cmSystemTools::VersionCompare(OP_EQUAL,&this->Generator->FrameworkVersion,"1.9.9");
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"less 2.0",8);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,(this->Generator->FrameworkVersion)._M_dataplus._M_p,
                 (this->Generator->FrameworkVersion)._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," tools at ",10);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
    cmTimestamp::CurrentTime(&local_1d0,&local_1d1,&local_1b0,true);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    cmXMLWriter::Comment(xout,local_1d0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  }
  return;
}

Assistant:

void cmCPackIFWCommon::WriteGeneratedByToStrim(cmXMLWriter& xout) const
{
  if (!this->Generator) {
    return;
  }

  std::ostringstream comment;
  comment << "Generated by CPack " << CMake_VERSION << " IFW generator "
          << "for QtIFW ";
  if (this->IsVersionEqual("1.9.9")) {
    comment << "less 2.0";
  } else {
    comment << this->Generator->FrameworkVersion;
  }
  comment << " tools at " << cmTimestamp().CurrentTime("", true);
  xout.Comment(comment.str().c_str());
}